

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int __thiscall DLevelScript::GetActorProperty(DLevelScript *this,int tid,int property)

{
  long lVar1;
  FRenderStyle *pFVar2;
  bool bVar3;
  int iVar4;
  AActor *pAVar5;
  long lVar6;
  char *str;
  uint uVar7;
  TObjPtr<AActor> *obj;
  AActor **ppAVar8;
  int local_1c;
  
  pAVar5 = GC::ReadBarrier<AActor>((AActor **)&this->activator);
  pAVar5 = SingleActorFromTID(tid,pAVar5);
  iVar4 = 0;
  if (pAVar5 == (AActor *)0x0) {
    return 0;
  }
  switch(property) {
  case 0:
    return pAVar5->health;
  case 1:
    ppAVar8 = (AActor **)pAVar5->Speed;
    break;
  case 2:
    iVar4 = (*(pAVar5->super_DThinker).super_DObject._vptr_DObject[0x23])(pAVar5,0,1);
    return iVar4;
  case 3:
    ppAVar8 = (AActor **)pAVar5->Alpha;
    break;
  case 4:
    lVar6 = 0;
    do {
      if (lVar6 == 0xe) {
        return 1;
      }
      lVar1 = lVar6 + 1;
      pFVar2 = LegacyRenderStyles + lVar6;
      lVar6 = lVar1;
    } while (pFVar2->AsDWORD != (pAVar5->RenderStyle).AsDWORD);
    return *(int *)(&UNK_0069333c + lVar1 * 4);
  case 5:
    lVar6 = (long)(pAVar5->SeeSound).super_FSoundID.ID;
    goto LAB_00484fdf;
  case 6:
    lVar6 = (long)(pAVar5->AttackSound).super_FSoundID.ID;
    goto LAB_00484fdf;
  case 7:
    lVar6 = (long)(pAVar5->PainSound).super_FSoundID.ID;
    goto LAB_00484fdf;
  case 8:
    lVar6 = (long)(pAVar5->DeathSound).super_FSoundID.ID;
    goto LAB_00484fdf;
  case 9:
    lVar6 = (long)(pAVar5->ActiveSound).super_FSoundID.ID;
LAB_00484fdf:
    if (lVar6 == 0) {
      str = (char *)0x0;
    }
    else {
      str = S_sfx.Array[lVar6].name.Chars;
    }
LAB_004850f2:
    iVar4 = ACSStringPool::AddString(&GlobalACSStrings,str);
    return iVar4;
  case 10:
    uVar7 = (pAVar5->flags).Value >> 5;
    goto LAB_00485073;
  case 0xb:
    uVar7 = (pAVar5->flags2).Value;
    goto LAB_00484df5;
  case 0xc:
    bVar3 = DObject::IsKindOf((DObject *)pAVar5,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar3) {
      return 0;
    }
    ppAVar8 = *(AActor ***)&pAVar5[1].super_DThinker.super_DObject.ObjectFlags;
    break;
  case 0xd:
    uVar7 = (pAVar5->flags5).Value >> 7;
    goto LAB_00485073;
  case 0xe:
    uVar7 = (pAVar5->flags4).Value >> 0x1e;
    goto LAB_00485073;
  case 0xf:
    ppAVar8 = (AActor **)pAVar5->Gravity;
    break;
  case 0x10:
    uVar7 = (pAVar5->flags).Value;
LAB_00484df5:
    uVar7 = uVar7 >> 0x1b;
    goto LAB_00485073;
  case 0x11:
    bVar3 = DObject::IsKindOf((DObject *)pAVar5,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar3) {
      return *(int *)&pAVar5[1].super_DThinker.super_DObject._vptr_DObject;
    }
    iVar4 = AActor::SpawnHealth(pAVar5);
    return iVar4;
  case 0x12:
    uVar7 = (pAVar5->flags).Value >> 0x11;
    goto LAB_00485073;
  case 0x13:
    uVar7 = (pAVar5->flags3).Value >> 0x12;
    goto LAB_00485073;
  case 0x14:
    (*(pAVar5->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_1c,pAVar5);
    iVar4 = ACSStringPool::AddString(&GlobalACSStrings,FName::NameData.NameArray[local_1c].Text);
    return iVar4;
  case 0x15:
    str = AActor::GetTag(pAVar5,(char *)0x0);
    goto LAB_004850f2;
  case 0x16:
    return pAVar5->Score;
  case 0x17:
    uVar7 = (pAVar5->flags6).Value >> 0x10;
    goto LAB_00485073;
  case 0x18:
    ppAVar8 = (AActor **)pAVar5->DamageFactor;
    break;
  case 0x19:
    iVar4 = DoGetMasterTID(pAVar5);
    return iVar4;
  case 0x1a:
    obj = &pAVar5->target;
    goto LAB_004850b4;
  case 0x1b:
    obj = &pAVar5->tracer;
LAB_004850b4:
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar5 == (AActor *)0x0) {
      return 0;
    }
    pAVar5 = GC::ReadBarrier<AActor>((AActor **)obj);
    return pAVar5->tid;
  case 0x1c:
    return pAVar5->waterlevel;
  case 0x1d:
    ppAVar8 = (AActor **)(pAVar5->Scale).X;
    break;
  case 0x1e:
    ppAVar8 = (AActor **)(pAVar5->Scale).Y;
    break;
  case 0x1f:
    uVar7 = (pAVar5->flags2).Value >> 0x1c;
LAB_00485073:
    return uVar7 & 1;
  case 0x20:
    return pAVar5->Mass;
  case 0x21:
    return pAVar5->accuracy;
  case 0x22:
    return pAVar5->stamina;
  case 0x23:
    ppAVar8 = (AActor **)pAVar5->Height;
    break;
  case 0x24:
    ppAVar8 = (AActor **)pAVar5->radius;
    break;
  case 0x25:
    return pAVar5->reactiontime;
  case 0x26:
    ppAVar8 = (AActor **)pAVar5->meleerange;
    break;
  case 0x27:
    bVar3 = DObject::IsKindOf((DObject *)pAVar5,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar3) {
      return 0;
    }
    ppAVar8 = pAVar5[1].sprev;
    break;
  case 0x28:
    bVar3 = DObject::IsKindOf((DObject *)pAVar5,APlayerPawn::RegistrationInfo.MyClass);
    if (!bVar3) {
      return 0;
    }
    ppAVar8 = (AActor **)pAVar5[1].SpriteAngle.Degrees;
    break;
  case 0x29:
    return pAVar5->fillcolor;
  case 0x2a:
    ppAVar8 = (AActor **)pAVar5->Friction;
    break;
  case 0x2b:
    ppAVar8 = (AActor **)pAVar5->DamageMultiply;
    break;
  case 0x2c:
    ppAVar8 = (AActor **)pAVar5->MaxStepHeight;
    break;
  case 0x2d:
    ppAVar8 = (AActor **)pAVar5->MaxDropOffHeight;
    break;
  case 0x2e:
    str = FName::NameData.NameArray[(pAVar5->DamageType).super_FName.Index].Text;
    goto LAB_004850f2;
  default:
    goto switchD_00484d60_default;
  }
  iVar4 = SUB84((double)ppAVar8 + 103079215104.0,0);
switchD_00484d60_default:
  return iVar4;
}

Assistant:

int DLevelScript::GetActorProperty (int tid, int property)
{
	AActor *actor = SingleActorFromTID (tid, activator);

	if (actor == NULL)
	{
		return 0;
	}
	switch (property)
	{
	case APROP_Health:		return actor->health;
	case APROP_Speed:		return DoubleToACS(actor->Speed);
	case APROP_Damage:		return actor->GetMissileDamage(0,1);
	case APROP_DamageFactor:return DoubleToACS(actor->DamageFactor);
	case APROP_DamageMultiplier: return DoubleToACS(actor->DamageMultiply);
	case APROP_Alpha:		return DoubleToACS(actor->Alpha);
	case APROP_RenderStyle:	for (int style = STYLE_None; style < STYLE_Count; ++style)
							{ // Check for a legacy render style that matches.
								if (LegacyRenderStyles[style] == actor->RenderStyle)
								{
									return LegacyRenderStyleIndices[style];
								}
							}
							// The current render style isn't expressable as a legacy style,
							// so pretends it's normal.
							return STYLE_Normal;
	case APROP_Gravity:		return DoubleToACS(actor->Gravity);
	case APROP_Invulnerable:return !!(actor->flags2 & MF2_INVULNERABLE);
	case APROP_Ambush:		return !!(actor->flags & MF_AMBUSH);
	case APROP_Dropped:		return !!(actor->flags & MF_DROPPED);
	case APROP_ChaseGoal:	return !!(actor->flags5 & MF5_CHASEGOAL);
	case APROP_Frightened:	return !!(actor->flags4 & MF4_FRIGHTENED);
	case APROP_Friendly:	return !!(actor->flags & MF_FRIENDLY);
	case APROP_Notarget:	return !!(actor->flags3 & MF3_NOTARGET);
	case APROP_Notrigger:	return !!(actor->flags6 & MF6_NOTRIGGER);
	case APROP_Dormant:		return !!(actor->flags2 & MF2_DORMANT);
	case APROP_SpawnHealth: if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
							{
								return static_cast<APlayerPawn *>(actor)->MaxHealth;
							}
							else
							{
								return actor->SpawnHealth();
							}

	case APROP_JumpZ:		if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
							{
								return DoubleToACS(static_cast<APlayerPawn *>(actor)->JumpZ);	// [GRB]
							}
							else
							{
								return 0;
							}
	case APROP_Score:		return actor->Score;
	case APROP_MasterTID:	return DoGetMasterTID (actor);
	case APROP_TargetTID:	return (actor->target != NULL)? actor->target->tid : 0;
	case APROP_TracerTID:	return (actor->tracer != NULL)? actor->tracer->tid : 0;
	case APROP_WaterLevel:	return actor->waterlevel;
	case APROP_ScaleX: 		return DoubleToACS(actor->Scale.X);
	case APROP_ScaleY: 		return DoubleToACS(actor->Scale.Y);
	case APROP_Mass: 		return actor->Mass;
	case APROP_Accuracy:    return actor->accuracy;
	case APROP_Stamina:     return actor->stamina;
	case APROP_Height:		return DoubleToACS(actor->Height);
	case APROP_Radius:		return DoubleToACS(actor->radius);
	case APROP_ReactionTime:return actor->reactiontime;
	case APROP_MeleeRange:	return DoubleToACS(actor->meleerange);
	case APROP_ViewHeight:	if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
							{
								return DoubleToACS(static_cast<APlayerPawn *>(actor)->ViewHeight);
							}
							else
							{
								return 0;
							}
	case APROP_AttackZOffset:
							if (actor->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
							{
								return DoubleToACS(static_cast<APlayerPawn *>(actor)->AttackZOffset);
							}
							else
							{
								return 0;
							}

	case APROP_SeeSound:	return GlobalACSStrings.AddString(actor->SeeSound);
	case APROP_AttackSound:	return GlobalACSStrings.AddString(actor->AttackSound);
	case APROP_PainSound:	return GlobalACSStrings.AddString(actor->PainSound);
	case APROP_DeathSound:	return GlobalACSStrings.AddString(actor->DeathSound);
	case APROP_ActiveSound:	return GlobalACSStrings.AddString(actor->ActiveSound);
	case APROP_Species:		return GlobalACSStrings.AddString(actor->GetSpecies());
	case APROP_NameTag:		return GlobalACSStrings.AddString(actor->GetTag());
	case APROP_StencilColor:return actor->fillcolor;
	case APROP_Friction:	return DoubleToACS(actor->Friction);
	case APROP_MaxStepHeight: return DoubleToACS(actor->MaxStepHeight);
	case APROP_MaxDropOffHeight: return DoubleToACS(actor->MaxDropOffHeight);
	case APROP_DamageType:	return GlobalACSStrings.AddString(actor->DamageType);

	default:				return 0;
	}
}